

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O3

Datatype * __thiscall TypeFactory::getBase(TypeFactory *this,int4 s,type_metatype m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  TypeArray *ct;
  Datatype *pDVar3;
  TypeBase tmp;
  Datatype local_58;
  
  if (s < 9) {
    if ((int)m < 3) goto LAB_00275044;
    pDVar3 = this->typecache[s][m - TYPE_FLOAT];
  }
  else {
    if (m != TYPE_FLOAT) goto LAB_00275044;
    if (s == 10) {
      lVar2 = 0x2b8;
    }
    else {
      if (s != 0x10) goto LAB_00275044;
      lVar2 = 0x2c0;
    }
    pDVar3 = *(Datatype **)((long)(this->typecache + -2) + 8 + lVar2);
  }
  if (pDVar3 != (Datatype *)0x0) {
    return pDVar3;
  }
LAB_00275044:
  if (s <= this->glb->max_basetype_size) {
    paVar1 = &local_58.name.field_2;
    local_58.name._M_string_length = 0;
    local_58.name.field_2._M_local_buf[0] = '\0';
    local_58.flags = 0;
    local_58.id = 0;
    local_58._vptr_Datatype = (_func_int **)&PTR_restoreXml_003c3438;
    local_58.size = s;
    local_58.name._M_dataplus._M_p = (pointer)paVar1;
    local_58.metatype = m;
    pDVar3 = findAdd(this,&local_58);
    local_58._vptr_Datatype = (_func_int **)&PTR_restoreXml_003c3088;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.name._M_dataplus._M_p);
    }
    return pDVar3;
  }
  ct = getTypeArray(this,s,this->typecache[1][5]);
  pDVar3 = findAdd(this,&ct->super_Datatype);
  return pDVar3;
}

Assistant:

Datatype *TypeFactory::getBase(int4 s,type_metatype m)

{
  Datatype *ct;
  if (s<9) {
    if (m >= TYPE_FLOAT) {
      ct = typecache[s][m-TYPE_FLOAT];
      if (ct != (Datatype *)0)
	return ct;
    }
  }
  else if (m==TYPE_FLOAT) {
    if (s==10)
      ct = typecache10;
    else if (s==16)
      ct = typecache16;
    else
      ct = (Datatype *)0;
    if (ct != (Datatype *)0)
      return ct;
  }
  if (s > glb->max_basetype_size) {
    // Create array of unknown bytes to match size
    ct = typecache[1][TYPE_UNKNOWN-TYPE_FLOAT];
    ct = getTypeArray(s,ct);
    return findAdd(*ct);
  }
  TypeBase tmp(s,m);
  return findAdd(tmp);
}